

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall djb::microfacet::eval(microfacet *this,vec3 *wi,vec3 *wo,void *user_args)

{
  long lVar1;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar2;
  args *paVar3;
  float_t *in_R8;
  byte bVar4;
  float fVar5;
  float_t fVar6;
  float_t fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar8;
  float fVar9;
  float fVar10;
  value_type vVar11;
  vec3 vVar12;
  float_t nrm;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  value_type F;
  vec3 local_a0;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Constant,_float,_float>,_float>
  local_90;
  args args;
  
  bVar4 = 0;
  vVar12 = operator+(wo,(vec3 *)user_args);
  fVar8 = vVar12.z;
  nrm = fVar8 * fVar8 + vVar12.x * vVar12.x + vVar12.y * vVar12.y;
  if (nrm <= 0.0) {
    (**(code **)(*(long *)wi + 0x10))(this,wi);
    pfVar2 = extraout_RDX;
  }
  else {
    fStack_c0 = (float)extraout_XMM0_Dc;
    local_c8 = (undefined1  [8])vVar12._0_8_;
    fStack_bc = (float)extraout_XMM0_Dd;
    if (in_R8 == (float_t *)0x0) {
      microfacet::args::standard();
    }
    else {
      paVar3 = &args;
      for (lVar1 = 0x13; lVar1 != 0; lVar1 = lVar1 + -1) {
        (paVar3->mtra).r[0].x = *in_R8;
        in_R8 = in_R8 + (ulong)bVar4 * -2 + 1;
        paVar3 = (args *)((long)paVar3 + (ulong)bVar4 * -8 + 4);
      }
    }
    fVar5 = inversesqrt<float>(&nrm);
    local_c8._0_4_ = (float)local_c8._0_4_ * fVar5;
    local_c8._4_4_ = (float)local_c8._4_4_ * fVar5;
    fStack_c0 = fStack_c0 * fVar5;
    fStack_bc = fStack_bc * fVar5;
    local_a0.y = (float_t)local_c8._4_4_;
    local_a0.x = (float_t)local_c8._0_4_;
    local_a0.z = fVar8 * fVar5;
    fVar6 = vndf((microfacet *)wi,&local_a0,wo,&args);
    fVar7 = gcd((microfacet *)wi,&local_a0,wo,(vec3 *)user_args,&args);
    fVar9 = (float)local_c8._4_4_ * wo->y;
    fVar10 = (float)local_c8._0_4_ * wo->x;
    local_c8._0_4_ = fVar7;
    fVar5 = fVar8 * fVar5 * wo->z + fVar10 + fVar9;
    fVar8 = 0.0;
    if (0.0 <= fVar5) {
      fVar8 = fVar5;
    }
    fVar5 = 1.0;
    if (fVar8 <= 1.0) {
      fVar5 = fVar8;
    }
    (**(code **)(**(long **)&wi->z + 0x20))(&F);
    if ((float)local_c8._0_4_ <= 0.0) {
      (**(code **)(*(long *)wi + 0x10))(this,wi);
    }
    else {
      local_90._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr2 =
           (fVar6 * (float)local_c8._0_4_) / (fVar5 * 4.0);
      local_90._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr1 = &F;
      std::valarray<float>::
      valarray<std::__detail::_BinClos<std::__multiplies,std::_ValArray,std::_Constant,float,float>>
                ((valarray<float> *)this,&local_90);
    }
    operator_delete(F._M_data);
    pfVar2 = extraout_RDX_00;
  }
  vVar11._M_data = pfVar2;
  vVar11._M_size = (size_t)this;
  return vVar11;
}

Assistant:

brdf::value_type
microfacet::eval(const vec3 &wi, const vec3 &wo, const void *user_args) const
{
	vec3 tmp = wi + wo;
	float_t nrm = dot(tmp, tmp);

	if (nrm > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wh = tmp * inversesqrt(nrm);
		float_t Dvis = vndf(wh, wi, args);
		float_t Gcd = gcd(wh, wi, wo, args);
		float_t zd = sat(dot(wh, wi));
		brdf::value_type F = m_fresnel->eval(zd);

		return Gcd > 0 ? F * ((Dvis * Gcd) / (4 * zd)) : zero_value();
	}

	return zero_value();
}